

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  ly_ctx *ctx;
  lyd_node *plVar1;
  lyd_node *plVar2;
  lyd_node *elem;
  uint uVar3;
  lys_module *plVar4;
  LY_ERR *pLVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  lyd_node *plVar9;
  void *pvVar10;
  ulong __n;
  char *pcVar11;
  char *model;
  int mod_len;
  char *name;
  
  ctx = data->schema->module->ctx;
  *ret = (lyd_node *)0x0;
  do {
    plVar9 = data;
    data = plVar9->parent;
  } while (plVar9->parent != (lyd_node *)0x0);
  plVar1 = plVar9->prev;
  elem = plVar9;
  while (plVar2 = plVar9, plVar1 != (lyd_node *)0x0) {
    plVar9 = plVar2->prev;
    plVar1 = plVar9->next;
    elem = plVar2;
  }
  uVar3 = 0;
  if (*path == '/') {
    pcVar11 = path + 1;
    uVar3 = parse_identifier(pcVar11);
    if (0 < (int)uVar3) {
      __n = (ulong)uVar3;
      if (pcVar11[__n] == ':') {
        uVar3 = parse_identifier(pcVar11 + __n + 1);
        if (0 < (int)uVar3) {
          pcVar11 = strndup(pcVar11,__n);
          if (pcVar11 != (char *)0x0) {
            plVar4 = ly_ctx_get_module(ctx,pcVar11,(char *)0x0);
            if (ctx->data_clb != (ly_module_data_clb)0x0) {
              if (plVar4 == (lys_module *)0x0) {
                pvVar10 = ctx->data_clb_data;
                pcVar7 = (char *)0x0;
                iVar6 = 0;
                pcVar8 = pcVar11;
              }
              else {
                if ((char)plVar4->field_0x40 < '\0') {
                  free(pcVar11);
                  goto LAB_0011b323;
                }
                pcVar7 = plVar4->ns;
                pvVar10 = ctx->data_clb_data;
                iVar6 = 1;
                pcVar8 = plVar4->name;
              }
              (*ctx->data_clb)(ctx,pcVar8,pcVar7,iVar6,pvVar10);
            }
            free(pcVar11);
            goto LAB_0011b323;
          }
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","resolve_instid");
          goto LAB_0011b3e2;
        }
      }
      else {
        uVar3 = ~uVar3;
      }
    }
  }
  else if (*path == '\0') {
LAB_0011b323:
    if (-1 < req_inst) {
      ly_vlog(LYE_NOREQINS,LY_VLOG_NONE,(void *)0x0,path);
      return 1;
    }
    if (ly_log_level < '\x02') {
      return 0;
    }
    ly_log(LY_LLVRB,"There is no instance of \"%s\", but it is not required.",path);
    return 0;
  }
  ly_vlog(LYE_INCHAR,LY_VLOG_LYD,elem,(ulong)(uint)(int)path[-uVar3],path + -uVar3);
LAB_0011b3e2:
  free((void *)0x0);
  return -1;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j;
    const struct lys_module *mod;
    struct ly_ctx *ctx = data->schema->module->ctx;
    const char *model, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (; data->parent; data = data->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (data->prev) {
        for (; data->prev->next; data = data->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        str = strndup(model, mod_len);
        if (!str) {
            LOGMEM;
            goto error;
        }
        mod = ly_ctx_get_module(ctx, str, NULL);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }
        free(str);

        if (!mod || !mod->implemented || mod->disabled) {
            break;
        }

        if (resolve_data(mod, name, name_len, data, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            j = resolve_instid_predicate(&path[i], &node_match);
            if (j < 1) {
                LOGVAL(LYE_INPRED, LY_VLOG_LYD, data, &path[i-j]);
                goto error;
            }
            i += j;

            if (!node_match.count) {
                /* no instance exists */
                break;
            }
        }
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(LYE_NOREQINS, LY_VLOG_NONE, NULL, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}